

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassThrough.cpp
# Opt level: O3

Event * __thiscall PassThrough::update(PassThrough *this,double n_dt)

{
  int iVar1;
  Event *pEVar2;
  Clock *pCVar3;
  double dVar4;
  double dVar5;
  
  if (this->eventType == Spike) {
    pEVar2 = (Event *)operator_new(0x28);
    iVar1 = this->multiplicity;
    dVar4 = this->weight;
    pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00122a08;
    *(undefined4 *)&pEVar2[1]._vptr_Event = 1;
    *(undefined8 *)&pEVar2[1].type = 0x3ff0000000000000;
    pEVar2->type = Spike;
    pCVar3 = Clock::getInstance();
    dVar5 = Clock::getCurrentTime(pCVar3);
    pEVar2->eventTime = dVar5;
    *(int *)&pEVar2[1]._vptr_Event = iVar1;
    *(double *)&pEVar2[1].type = dVar4;
  }
  else {
    pEVar2 = (Event *)operator_new(0x18);
    pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00122a58;
    pEVar2->type = No;
    pCVar3 = Clock::getInstance();
    dVar4 = Clock::getCurrentTime(pCVar3);
    pEVar2->eventTime = dVar4;
  }
  return pEVar2;
}

Assistant:

Event* PassThrough::update(double n_dt) {
    if(eventType == EventType::Spike) {
        return new SpikeEvent(multiplicity, weight);
    }
    else {
        return new NoEvent();
    }
}